

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cpp
# Opt level: O0

bool booster::locale::gnu_gettext::mo_file::key_equals(char *real_key,char *cntx,char *key)

{
  int iVar1;
  size_t sVar2;
  size_t __n;
  size_t __n_00;
  char *in_RDX;
  char *in_RSI;
  char *in_RDI;
  size_t key_len;
  size_t cntx_len;
  size_t real_len;
  bool local_39;
  bool local_1;
  
  if (in_RSI == (char *)0x0) {
    iVar1 = strcmp(in_RDI,in_RDX);
    local_1 = iVar1 == 0;
  }
  else {
    sVar2 = strlen(in_RDI);
    __n = strlen(in_RSI);
    __n_00 = strlen(in_RDX);
    if (__n + 1 + __n_00 == sVar2) {
      iVar1 = memcmp(in_RDI,in_RSI,__n);
      local_39 = false;
      if ((iVar1 == 0) && (local_39 = false, in_RDI[__n] == '\x04')) {
        iVar1 = memcmp(in_RDI + __n + 1,in_RDX,__n_00);
        local_39 = iVar1 == 0;
      }
      local_1 = local_39;
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

static bool key_equals(char const *real_key,char const *cntx,char const *key)
                {
                    if(cntx == 0)
                        return strcmp(real_key,key) == 0;
                    else {
                        size_t real_len = strlen(real_key);
                        size_t cntx_len = strlen(cntx);
                        size_t key_len = strlen(key);
                        if(cntx_len + 1 + key_len != real_len)
                            return false;
                        return 
                            memcmp(real_key,cntx,cntx_len) == 0
                            && real_key[cntx_len] == '\4'
                            && memcmp(real_key + cntx_len + 1 ,key,key_len) == 0;
                    }
                }